

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Scene *pSVar8;
  Geometry *pGVar9;
  RTCIntersectArguments *pRVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  byte bVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  AABBNodeMB4D *node1;
  ulong uVar35;
  long lVar36;
  undefined4 uVar37;
  undefined1 (*pauVar38) [16];
  ulong uVar39;
  undefined1 auVar40 [8];
  long lVar41;
  uint uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  long lVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar66;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar64;
  float fVar65;
  undefined1 auVar63 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  float fVar82;
  float fVar92;
  float fVar93;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar94;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  float fVar95;
  float fVar105;
  float fVar106;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar107;
  undefined1 auVar104 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar108 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [64];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [64];
  undefined1 auVar118 [16];
  float fVar120;
  undefined1 auVar119 [64];
  undefined1 auVar121 [16];
  undefined1 auVar122 [64];
  float fVar123;
  float fVar125;
  uint uVar126;
  float fVar127;
  uint uVar128;
  float fVar129;
  uint uVar130;
  undefined1 auVar124 [64];
  float fVar131;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar132 [64];
  undefined1 auVar136 [16];
  undefined1 auVar137 [64];
  undefined1 auVar138 [16];
  undefined1 auVar139 [64];
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar140 [64];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 (*local_26f0) [16];
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  int local_26a4;
  undefined1 local_26a0 [16];
  undefined1 local_2690 [16];
  undefined1 local_2680 [8];
  float fStack_2678;
  float fStack_2674;
  undefined1 local_2670 [8];
  float fStack_2668;
  float fStack_2664;
  undefined1 local_2660 [16];
  RayQueryContext *local_2648;
  undefined1 local_2640 [8];
  float fStack_2638;
  float fStack_2634;
  ulong local_2628;
  long local_2620;
  ulong local_2618;
  ulong local_2610;
  long local_2608;
  RTCFilterFunctionNArguments local_2600;
  float local_25d0;
  uint local_25cc;
  uint local_25c8;
  float local_25c4;
  float local_25c0;
  undefined4 local_25bc;
  uint local_25b8;
  uint local_25b4;
  uint local_25b0;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 local_2590;
  undefined8 uStack_2588;
  undefined1 local_2580 [32];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined1 local_2530 [16];
  float local_2520 [4];
  float local_2510 [4];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 local_24d0;
  undefined8 uStack_24c8;
  undefined1 local_24c0 [8];
  float fStack_24b8;
  float fStack_24b4;
  undefined1 local_24b0 [8];
  float fStack_24a8;
  float fStack_24a4;
  undefined1 local_24a0 [8];
  float fStack_2498;
  float fStack_2494;
  undefined8 local_2490;
  undefined8 uStack_2488;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_26f0 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    aVar4 = (ray->super_RayK<1>).dir.field_0;
    auVar67 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar98._8_4_ = 0x7fffffff;
    auVar98._0_8_ = 0x7fffffff7fffffff;
    auVar98._12_4_ = 0x7fffffff;
    auVar98 = vandps_avx((undefined1  [16])aVar4,auVar98);
    auVar96._8_4_ = 0x219392ef;
    auVar96._0_8_ = 0x219392ef219392ef;
    auVar96._12_4_ = 0x219392ef;
    auVar98 = vcmpps_avx(auVar98,auVar96,1);
    auVar98 = vblendvps_avx((undefined1  [16])aVar4,auVar96,auVar98);
    fVar55 = (ray->super_RayK<1>).tfar;
    auVar81 = ZEXT464((uint)fVar55);
    auVar96 = vrcpps_avx(auVar98);
    fVar64 = auVar96._0_4_;
    auVar83._0_4_ = auVar98._0_4_ * fVar64;
    fVar65 = auVar96._4_4_;
    auVar83._4_4_ = auVar98._4_4_ * fVar65;
    fVar66 = auVar96._8_4_;
    auVar83._8_4_ = auVar98._8_4_ * fVar66;
    fVar120 = auVar96._12_4_;
    auVar83._12_4_ = auVar98._12_4_ * fVar120;
    auVar108._8_4_ = 0x3f800000;
    auVar108._0_8_ = 0x3f8000003f800000;
    auVar108._12_4_ = 0x3f800000;
    auVar98 = vsubps_avx(auVar108,auVar83);
    uVar37 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23c0._4_4_ = uVar37;
    local_23c0._0_4_ = uVar37;
    local_23c0._8_4_ = uVar37;
    local_23c0._12_4_ = uVar37;
    local_23c0._16_4_ = uVar37;
    local_23c0._20_4_ = uVar37;
    local_23c0._24_4_ = uVar37;
    local_23c0._28_4_ = uVar37;
    auVar119 = ZEXT3264(local_23c0);
    uVar37 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_23e0._4_4_ = uVar37;
    local_23e0._0_4_ = uVar37;
    local_23e0._8_4_ = uVar37;
    local_23e0._12_4_ = uVar37;
    local_23e0._16_4_ = uVar37;
    local_23e0._20_4_ = uVar37;
    local_23e0._24_4_ = uVar37;
    local_23e0._28_4_ = uVar37;
    auVar122 = ZEXT3264(local_23e0);
    uVar37 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2400._4_4_ = uVar37;
    local_2400._0_4_ = uVar37;
    local_2400._8_4_ = uVar37;
    local_2400._12_4_ = uVar37;
    local_2400._16_4_ = uVar37;
    local_2400._20_4_ = uVar37;
    local_2400._24_4_ = uVar37;
    local_2400._28_4_ = uVar37;
    auVar124 = ZEXT3264(local_2400);
    auVar97._0_4_ = fVar64 + fVar64 * auVar98._0_4_;
    auVar97._4_4_ = fVar65 + fVar65 * auVar98._4_4_;
    auVar97._8_4_ = fVar66 + fVar66 * auVar98._8_4_;
    auVar97._12_4_ = fVar120 + fVar120 * auVar98._12_4_;
    auVar98 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar55));
    auVar96 = vshufps_avx(auVar97,auVar97,0);
    local_2420._16_16_ = auVar96;
    local_2420._0_16_ = auVar96;
    auVar132 = ZEXT3264(local_2420);
    auVar96 = vmovshdup_avx(auVar97);
    auVar113 = ZEXT1664(auVar96);
    auVar83 = vshufps_avx(auVar97,auVar97,0x55);
    local_2440._16_16_ = auVar83;
    local_2440._0_16_ = auVar83;
    auVar137 = ZEXT3264(local_2440);
    auVar83 = vshufpd_avx(auVar97,auVar97,1);
    auVar117 = ZEXT1664(auVar83);
    auVar108 = vshufps_avx(auVar97,auVar97,0xaa);
    auVar104 = ZEXT1664(auVar108);
    local_2460._16_16_ = auVar108;
    local_2460._0_16_ = auVar108;
    auVar139 = ZEXT3264(local_2460);
    uVar39 = (ulong)(auVar97._0_4_ < 0.0) << 5;
    uVar51 = (ulong)(auVar96._0_4_ < 0.0) << 5 | 0x40;
    uVar54 = (ulong)(auVar83._0_4_ < 0.0) << 5 | 0x80;
    uVar53 = uVar39 ^ 0x20;
    auVar67 = vshufps_avx(auVar67,auVar67,0);
    local_2480._16_16_ = auVar67;
    local_2480._0_16_ = auVar67;
    auVar140 = ZEXT3264(local_2480);
    auVar98 = vshufps_avx(auVar98,auVar98,0);
    auVar63 = ZEXT3264(CONCAT1616(auVar98,auVar98));
    local_25a0 = mm_lookupmask_ps._240_8_;
    uStack_2598 = mm_lookupmask_ps._248_8_;
    local_2648 = context;
    local_2628 = uVar39;
LAB_00e5da56:
    if (local_26f0 != (undefined1 (*) [16])&local_23a0) {
      pauVar38 = local_26f0 + -1;
      local_26f0 = local_26f0 + -1;
      if (*(float *)(*pauVar38 + 8) <= auVar81._0_4_) {
        uVar49 = *(ulong *)*local_26f0;
        while ((uVar49 & 8) == 0) {
          uVar35 = uVar49 & 0xfffffffffffffff0;
          fVar55 = (ray->super_RayK<1>).dir.field_0.m128[3];
          auVar91._4_4_ = fVar55;
          auVar91._0_4_ = fVar55;
          auVar91._8_4_ = fVar55;
          auVar91._12_4_ = fVar55;
          auVar91._16_4_ = fVar55;
          auVar91._20_4_ = fVar55;
          auVar91._24_4_ = fVar55;
          auVar91._28_4_ = fVar55;
          pfVar3 = (float *)(uVar35 + 0x100 + uVar39);
          pfVar1 = (float *)(uVar35 + 0x40 + uVar39);
          auVar80._0_4_ = fVar55 * *pfVar3 + *pfVar1;
          auVar80._4_4_ = fVar55 * pfVar3[1] + pfVar1[1];
          auVar80._8_4_ = fVar55 * pfVar3[2] + pfVar1[2];
          auVar80._12_4_ = fVar55 * pfVar3[3] + pfVar1[3];
          auVar80._16_4_ = fVar55 * pfVar3[4] + pfVar1[4];
          auVar80._20_4_ = fVar55 * pfVar3[5] + pfVar1[5];
          auVar80._24_4_ = fVar55 * pfVar3[6] + pfVar1[6];
          auVar80._28_4_ = auVar81._28_4_ + pfVar1[7];
          auVar80 = vsubps_avx(auVar80,auVar119._0_32_);
          auVar26._4_4_ = auVar132._4_4_ * auVar80._4_4_;
          auVar26._0_4_ = auVar132._0_4_ * auVar80._0_4_;
          auVar26._8_4_ = auVar132._8_4_ * auVar80._8_4_;
          auVar26._12_4_ = auVar132._12_4_ * auVar80._12_4_;
          auVar26._16_4_ = auVar132._16_4_ * auVar80._16_4_;
          auVar26._20_4_ = auVar132._20_4_ * auVar80._20_4_;
          auVar26._24_4_ = auVar132._24_4_ * auVar80._24_4_;
          auVar26._28_4_ = auVar80._28_4_;
          auVar80 = vmaxps_avx(auVar140._0_32_,auVar26);
          pfVar3 = (float *)(uVar35 + 0x100 + uVar51);
          pfVar1 = (float *)(uVar35 + 0x40 + uVar51);
          auVar102._0_4_ = fVar55 * *pfVar3 + *pfVar1;
          auVar102._4_4_ = fVar55 * pfVar3[1] + pfVar1[1];
          auVar102._8_4_ = fVar55 * pfVar3[2] + pfVar1[2];
          auVar102._12_4_ = fVar55 * pfVar3[3] + pfVar1[3];
          auVar102._16_4_ = fVar55 * pfVar3[4] + pfVar1[4];
          auVar102._20_4_ = fVar55 * pfVar3[5] + pfVar1[5];
          auVar102._24_4_ = fVar55 * pfVar3[6] + pfVar1[6];
          auVar102._28_4_ = auVar104._28_4_ + pfVar1[7];
          auVar26 = vsubps_avx(auVar102,auVar122._0_32_);
          auVar29._4_4_ = auVar137._4_4_ * auVar26._4_4_;
          auVar29._0_4_ = auVar137._0_4_ * auVar26._0_4_;
          auVar29._8_4_ = auVar137._8_4_ * auVar26._8_4_;
          auVar29._12_4_ = auVar137._12_4_ * auVar26._12_4_;
          auVar29._16_4_ = auVar137._16_4_ * auVar26._16_4_;
          auVar29._20_4_ = auVar137._20_4_ * auVar26._20_4_;
          auVar29._24_4_ = auVar137._24_4_ * auVar26._24_4_;
          auVar29._28_4_ = auVar26._28_4_;
          pfVar3 = (float *)(uVar35 + 0x100 + uVar54);
          pfVar1 = (float *)(uVar35 + 0x40 + uVar54);
          auVar111._0_4_ = fVar55 * *pfVar3 + *pfVar1;
          auVar111._4_4_ = fVar55 * pfVar3[1] + pfVar1[1];
          auVar111._8_4_ = fVar55 * pfVar3[2] + pfVar1[2];
          auVar111._12_4_ = fVar55 * pfVar3[3] + pfVar1[3];
          auVar111._16_4_ = fVar55 * pfVar3[4] + pfVar1[4];
          auVar111._20_4_ = fVar55 * pfVar3[5] + pfVar1[5];
          auVar111._24_4_ = fVar55 * pfVar3[6] + pfVar1[6];
          auVar111._28_4_ = auVar113._28_4_ + pfVar1[7];
          auVar27 = vsubps_avx(auVar111,auVar124._0_32_);
          auVar30._4_4_ = auVar139._4_4_ * auVar27._4_4_;
          auVar30._0_4_ = auVar139._0_4_ * auVar27._0_4_;
          auVar30._8_4_ = auVar139._8_4_ * auVar27._8_4_;
          auVar30._12_4_ = auVar139._12_4_ * auVar27._12_4_;
          auVar30._16_4_ = auVar139._16_4_ * auVar27._16_4_;
          auVar30._20_4_ = auVar139._20_4_ * auVar27._20_4_;
          auVar30._24_4_ = auVar139._24_4_ * auVar27._24_4_;
          auVar30._28_4_ = auVar27._28_4_;
          auVar26 = vmaxps_avx(auVar29,auVar30);
          local_2580 = vmaxps_avx(auVar80,auVar26);
          pfVar3 = (float *)(uVar35 + 0x100 + uVar53);
          pfVar1 = (float *)(uVar35 + 0x40 + uVar53);
          auVar103._0_4_ = fVar55 * *pfVar3 + *pfVar1;
          auVar103._4_4_ = fVar55 * pfVar3[1] + pfVar1[1];
          auVar103._8_4_ = fVar55 * pfVar3[2] + pfVar1[2];
          auVar103._12_4_ = fVar55 * pfVar3[3] + pfVar1[3];
          auVar103._16_4_ = fVar55 * pfVar3[4] + pfVar1[4];
          auVar103._20_4_ = fVar55 * pfVar3[5] + pfVar1[5];
          auVar103._24_4_ = fVar55 * pfVar3[6] + pfVar1[6];
          auVar103._28_4_ = auVar26._28_4_ + pfVar1[7];
          auVar80 = vsubps_avx(auVar103,auVar119._0_32_);
          auVar31._4_4_ = auVar132._4_4_ * auVar80._4_4_;
          auVar31._0_4_ = auVar132._0_4_ * auVar80._0_4_;
          auVar31._8_4_ = auVar132._8_4_ * auVar80._8_4_;
          auVar31._12_4_ = auVar132._12_4_ * auVar80._12_4_;
          auVar31._16_4_ = auVar132._16_4_ * auVar80._16_4_;
          auVar31._20_4_ = auVar132._20_4_ * auVar80._20_4_;
          auVar31._24_4_ = auVar132._24_4_ * auVar80._24_4_;
          auVar31._28_4_ = auVar80._28_4_;
          pfVar3 = (float *)(uVar35 + 0x100 + (uVar51 ^ 0x20));
          auVar80 = vminps_avx(auVar63._0_32_,auVar31);
          pfVar1 = (float *)(uVar35 + 0x40 + (uVar51 ^ 0x20));
          auVar112._0_4_ = fVar55 * *pfVar3 + *pfVar1;
          auVar112._4_4_ = fVar55 * pfVar3[1] + pfVar1[1];
          auVar112._8_4_ = fVar55 * pfVar3[2] + pfVar1[2];
          auVar112._12_4_ = fVar55 * pfVar3[3] + pfVar1[3];
          auVar112._16_4_ = fVar55 * pfVar3[4] + pfVar1[4];
          auVar112._20_4_ = fVar55 * pfVar3[5] + pfVar1[5];
          auVar112._24_4_ = fVar55 * pfVar3[6] + pfVar1[6];
          auVar112._28_4_ = auVar27._28_4_ + pfVar1[7];
          auVar26 = vsubps_avx(auVar112,auVar122._0_32_);
          pfVar3 = (float *)(uVar35 + 0x100 + (uVar54 ^ 0x20));
          pfVar1 = (float *)(uVar35 + 0x40 + (uVar54 ^ 0x20));
          auVar116._0_4_ = fVar55 * *pfVar3 + *pfVar1;
          auVar116._4_4_ = fVar55 * pfVar3[1] + pfVar1[1];
          auVar116._8_4_ = fVar55 * pfVar3[2] + pfVar1[2];
          auVar116._12_4_ = fVar55 * pfVar3[3] + pfVar1[3];
          auVar116._16_4_ = fVar55 * pfVar3[4] + pfVar1[4];
          auVar116._20_4_ = fVar55 * pfVar3[5] + pfVar1[5];
          auVar116._24_4_ = fVar55 * pfVar3[6] + pfVar1[6];
          auVar116._28_4_ = auVar117._28_4_ + pfVar1[7];
          auVar27._4_4_ = auVar137._4_4_ * auVar26._4_4_;
          auVar27._0_4_ = auVar137._0_4_ * auVar26._0_4_;
          auVar27._8_4_ = auVar137._8_4_ * auVar26._8_4_;
          auVar27._12_4_ = auVar137._12_4_ * auVar26._12_4_;
          auVar27._16_4_ = auVar137._16_4_ * auVar26._16_4_;
          auVar27._20_4_ = auVar137._20_4_ * auVar26._20_4_;
          auVar27._24_4_ = auVar137._24_4_ * auVar26._24_4_;
          auVar27._28_4_ = auVar26._28_4_;
          auVar26 = vsubps_avx(auVar116,auVar124._0_32_);
          auVar32._4_4_ = auVar139._4_4_ * auVar26._4_4_;
          auVar32._0_4_ = auVar139._0_4_ * auVar26._0_4_;
          auVar32._8_4_ = auVar139._8_4_ * auVar26._8_4_;
          auVar32._12_4_ = auVar139._12_4_ * auVar26._12_4_;
          auVar32._16_4_ = auVar139._16_4_ * auVar26._16_4_;
          auVar32._20_4_ = auVar139._20_4_ * auVar26._20_4_;
          auVar32._24_4_ = auVar139._24_4_ * auVar26._24_4_;
          auVar32._28_4_ = auVar26._28_4_;
          auVar117 = ZEXT3264(auVar32);
          auVar26 = vminps_avx(auVar27,auVar32);
          auVar80 = vminps_avx(auVar80,auVar26);
          auVar80 = vcmpps_avx(local_2580,auVar80,2);
          if (((uint)uVar49 & 7) == 6) {
            auVar26 = vcmpps_avx(*(undefined1 (*) [32])(uVar35 + 0x1c0),auVar91,2);
            auVar27 = vcmpps_avx(auVar91,*(undefined1 (*) [32])(uVar35 + 0x1e0),1);
            auVar27 = vandps_avx(auVar26,auVar27);
            auVar80 = vandps_avx(auVar27,auVar80);
            auVar98 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
          }
          else {
            auVar98 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
          }
          auVar113 = ZEXT3264(auVar26);
          auVar98 = vpsllw_avx(auVar98,0xf);
          auVar104 = ZEXT1664(auVar98);
          if ((((((((auVar98 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar98 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar98 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar98 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar98 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar98 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar98 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar98[0xf]) {
            auVar98 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                             ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
            auVar81 = ZEXT1664(auVar98);
            goto LAB_00e5da56;
          }
          auVar98 = vpacksswb_avx(auVar98,auVar98);
          auVar81 = ZEXT1664(auVar98);
          bVar28 = SUB161(auVar98 >> 7,0) & 1 | (SUB161(auVar98 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar98 >> 0x17,0) & 1) << 2 | (SUB161(auVar98 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar98 >> 0x27,0) & 1) << 4 | (SUB161(auVar98 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar98 >> 0x37,0) & 1) << 6 | SUB161(auVar98 >> 0x3f,0) << 7;
          lVar36 = 0;
          if (bVar28 != 0) {
            for (; (bVar28 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
            }
          }
          uVar49 = *(ulong *)(uVar35 + lVar36 * 8);
          uVar42 = bVar28 - 1 & (uint)bVar28;
          if (uVar42 != 0) {
            uVar126 = *(uint *)(local_2580 + lVar36 * 4);
            lVar36 = 0;
            if (uVar42 != 0) {
              for (; (uVar42 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
              }
            }
            uVar43 = *(ulong *)(uVar35 + lVar36 * 8);
            uVar128 = *(uint *)(local_2580 + lVar36 * 4);
            uVar42 = uVar42 - 1 & uVar42;
            if (uVar42 == 0) {
              if (uVar126 < uVar128) {
                *(ulong *)*local_26f0 = uVar43;
                *(uint *)(*local_26f0 + 8) = uVar128;
                local_26f0 = local_26f0 + 1;
              }
              else {
                *(ulong *)*local_26f0 = uVar49;
                *(uint *)(*local_26f0 + 8) = uVar126;
                local_26f0 = local_26f0 + 1;
                uVar49 = uVar43;
              }
            }
            else {
              auVar67._8_8_ = 0;
              auVar67._0_8_ = uVar49;
              auVar98 = vpunpcklqdq_avx(auVar67,ZEXT416(uVar126));
              auVar84._8_8_ = 0;
              auVar84._0_8_ = uVar43;
              auVar67 = vpunpcklqdq_avx(auVar84,ZEXT416(uVar128));
              lVar36 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                }
              }
              auVar99._8_8_ = 0;
              auVar99._0_8_ = *(ulong *)(uVar35 + lVar36 * 8);
              auVar83 = vpunpcklqdq_avx(auVar99,ZEXT416(*(uint *)(local_2580 + lVar36 * 4)));
              auVar104 = ZEXT1664(auVar83);
              auVar96 = vpcmpgtd_avx(auVar67,auVar98);
              auVar113 = ZEXT1664(auVar96);
              uVar42 = uVar42 - 1 & uVar42;
              if (uVar42 == 0) {
                auVar108 = vpshufd_avx(auVar96,0xaa);
                auVar96 = vblendvps_avx(auVar67,auVar98,auVar108);
                auVar98 = vblendvps_avx(auVar98,auVar67,auVar108);
                auVar67 = vpcmpgtd_avx(auVar83,auVar96);
                auVar108 = vpshufd_avx(auVar67,0xaa);
                auVar67 = vblendvps_avx(auVar83,auVar96,auVar108);
                auVar113 = ZEXT1664(auVar67);
                auVar96 = vblendvps_avx(auVar96,auVar83,auVar108);
                auVar83 = vpcmpgtd_avx(auVar96,auVar98);
                auVar108 = vpshufd_avx(auVar83,0xaa);
                auVar104 = ZEXT1664(auVar108);
                auVar83 = vblendvps_avx(auVar96,auVar98,auVar108);
                auVar117 = ZEXT1664(auVar83);
                auVar98 = vblendvps_avx(auVar98,auVar96,auVar108);
                auVar81 = ZEXT1664(auVar98);
                *local_26f0 = auVar98;
                local_26f0[1] = auVar83;
                uVar49 = auVar67._0_8_;
                local_26f0 = local_26f0 + 2;
              }
              else {
                lVar36 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                  }
                }
                auVar114._8_8_ = 0;
                auVar114._0_8_ = *(ulong *)(uVar35 + lVar36 * 8);
                auVar108 = vpunpcklqdq_avx(auVar114,ZEXT416(*(uint *)(local_2580 + lVar36 * 4)));
                auVar117 = ZEXT1664(auVar108);
                uVar42 = uVar42 - 1 & uVar42;
                uVar49 = (ulong)uVar42;
                if (uVar42 == 0) {
                  auVar97 = vpshufd_avx(auVar96,0xaa);
                  auVar96 = vblendvps_avx(auVar67,auVar98,auVar97);
                  auVar98 = vblendvps_avx(auVar98,auVar67,auVar97);
                  auVar67 = vpcmpgtd_avx(auVar108,auVar83);
                  auVar97 = vpshufd_avx(auVar67,0xaa);
                  auVar67 = vblendvps_avx(auVar108,auVar83,auVar97);
                  auVar83 = vblendvps_avx(auVar83,auVar108,auVar97);
                  auVar108 = vpcmpgtd_avx(auVar83,auVar98);
                  auVar97 = vpshufd_avx(auVar108,0xaa);
                  auVar108 = vblendvps_avx(auVar83,auVar98,auVar97);
                  auVar117 = ZEXT1664(auVar108);
                  auVar98 = vblendvps_avx(auVar98,auVar83,auVar97);
                  auVar81 = ZEXT1664(auVar98);
                  auVar83 = vpcmpgtd_avx(auVar67,auVar96);
                  auVar97 = vpshufd_avx(auVar83,0xaa);
                  auVar83 = vblendvps_avx(auVar67,auVar96,auVar97);
                  auVar104 = ZEXT1664(auVar83);
                  auVar67 = vblendvps_avx(auVar96,auVar67,auVar97);
                  auVar96 = vpcmpgtd_avx(auVar108,auVar67);
                  auVar97 = vpshufd_avx(auVar96,0xaa);
                  auVar113 = ZEXT1664(auVar97);
                  auVar96 = vblendvps_avx(auVar108,auVar67,auVar97);
                  auVar67 = vblendvps_avx(auVar67,auVar108,auVar97);
                  *local_26f0 = auVar98;
                  local_26f0[1] = auVar67;
                  local_26f0[2] = auVar96;
                  uVar49 = auVar83._0_8_;
                  local_26f0 = local_26f0 + 3;
                }
                else {
                  *local_26f0 = auVar98;
                  local_26f0[1] = auVar67;
                  local_26f0[2] = auVar83;
                  pauVar38 = local_26f0 + 3;
                  local_26f0[3] = auVar108;
                  do {
                    lVar36 = 0;
                    if (uVar49 != 0) {
                      for (; (uVar49 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                      }
                    }
                    auVar68._8_8_ = 0;
                    auVar68._0_8_ = *(ulong *)(uVar35 + lVar36 * 8);
                    auVar98 = vpunpcklqdq_avx(auVar68,ZEXT416(*(uint *)(local_2580 + lVar36 * 4)));
                    pauVar38[1] = auVar98;
                    pauVar38 = pauVar38 + 1;
                    uVar49 = uVar49 & uVar49 - 1;
                  } while (uVar49 != 0);
                  lVar36 = 0;
                  while (auVar81 = ZEXT1664(auVar98), pauVar38 != local_26f0) {
                    auVar98 = local_26f0[1];
                    uVar42 = vextractps_avx(auVar98,2);
                    for (lVar41 = 0x10;
                        (lVar36 != lVar41 && (*(uint *)(local_26f0[-1] + lVar41 + 8) < uVar42));
                        lVar41 = lVar41 + -0x10) {
                      *(undefined1 (*) [16])(*local_26f0 + lVar41) =
                           *(undefined1 (*) [16])(local_26f0[-1] + lVar41);
                    }
                    *(undefined1 (*) [16])(*local_26f0 + lVar41) = auVar98;
                    lVar36 = lVar36 + -0x10;
                    local_26f0 = local_26f0 + 1;
                  }
                  uVar49 = *(ulong *)*pauVar38;
                  local_26f0 = pauVar38;
                }
              }
            }
          }
        }
        local_2620 = (ulong)((uint)uVar49 & 0xf) - 8;
        uVar49 = uVar49 & 0xfffffffffffffff0;
        for (local_2608 = 0; local_2608 != local_2620; local_2608 = local_2608 + 1) {
          lVar50 = local_2608 * 0x50;
          pSVar8 = context->scene;
          pGVar9 = (pSVar8->geometries).items[*(uint *)(uVar49 + 0x30 + lVar50)].ptr;
          fVar55 = (pGVar9->time_range).lower;
          fVar55 = pGVar9->fnumTimeSegments *
                   (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar55) /
                   ((pGVar9->time_range).upper - fVar55));
          auVar98 = vroundss_avx(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55),9);
          auVar98 = vminss_avx(auVar98,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
          auVar57 = vmaxss_avx(ZEXT816(0),auVar98);
          lVar41 = (long)(int)auVar57._0_4_ * 0x38;
          uVar52 = (ulong)*(uint *)(uVar49 + 4 + lVar50);
          lVar36 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar41);
          lVar41 = *(long *)(*(long *)&pGVar9[2].numPrimitives + 0x38 + lVar41);
          auVar98 = *(undefined1 (*) [16])(lVar36 + (ulong)*(uint *)(uVar49 + lVar50) * 4);
          uVar35 = (ulong)*(uint *)(uVar49 + 0x10 + lVar50);
          auVar67 = *(undefined1 (*) [16])(lVar36 + uVar35 * 4);
          uVar43 = (ulong)*(uint *)(uVar49 + 0x20 + lVar50);
          auVar59 = *(undefined1 (*) [16])(lVar36 + uVar43 * 4);
          auVar96 = *(undefined1 (*) [16])(lVar36 + uVar52 * 4);
          uVar44 = (ulong)*(uint *)(uVar49 + 0x14 + lVar50);
          auVar83 = *(undefined1 (*) [16])(lVar36 + uVar44 * 4);
          uVar45 = (ulong)*(uint *)(uVar49 + 0x24 + lVar50);
          auVar69 = *(undefined1 (*) [16])(lVar36 + uVar45 * 4);
          uVar46 = (ulong)*(uint *)(uVar49 + 8 + lVar50);
          auVar108 = *(undefined1 (*) [16])(lVar36 + uVar46 * 4);
          local_2610 = (ulong)*(uint *)(uVar49 + 0x18 + lVar50);
          auVar97 = *(undefined1 (*) [16])(lVar36 + local_2610 * 4);
          uVar47 = (ulong)*(uint *)(uVar49 + 0x28 + lVar50);
          auVar84 = *(undefined1 (*) [16])(lVar36 + uVar47 * 4);
          uVar48 = (ulong)*(uint *)(uVar49 + 0xc + lVar50);
          auVar99 = *(undefined1 (*) [16])(lVar36 + uVar48 * 4);
          local_2618 = (ulong)*(uint *)(uVar49 + 0x1c + lVar50);
          auVar114 = *(undefined1 (*) [16])(lVar36 + local_2618 * 4);
          uVar39 = (ulong)*(uint *)(uVar49 + 0x2c + lVar50);
          auVar68 = *(undefined1 (*) [16])(lVar36 + uVar39 * 4);
          auVar5 = *(undefined1 (*) [16])(lVar41 + (ulong)*(uint *)(uVar49 + lVar50) * 4);
          auVar56 = *(undefined1 (*) [16])(lVar41 + uVar35 * 4);
          fVar55 = fVar55 - auVar57._0_4_;
          auVar57 = vunpcklps_avx(auVar98,auVar108);
          auVar108 = vunpckhps_avx(auVar98,auVar108);
          auVar58 = vunpcklps_avx(auVar96,auVar99);
          auVar96 = vunpckhps_avx(auVar96,auVar99);
          auVar98 = *(undefined1 (*) [16])(lVar41 + uVar52 * 4);
          _local_24b0 = vunpcklps_avx(auVar108,auVar96);
          auVar79 = _local_24b0;
          auVar99 = vunpcklps_avx(auVar57,auVar58);
          auVar108 = vunpckhps_avx(auVar57,auVar58);
          auVar57 = vunpcklps_avx(auVar67,auVar97);
          auVar96 = vunpckhps_avx(auVar67,auVar97);
          auVar97 = vunpcklps_avx(auVar83,auVar114);
          auVar83 = vunpckhps_avx(auVar83,auVar114);
          auVar67 = *(undefined1 (*) [16])(lVar41 + uVar46 * 4);
          auVar114 = vunpcklps_avx(auVar96,auVar83);
          auVar58 = vunpcklps_avx(auVar57,auVar97);
          _local_24c0 = vunpckhps_avx(auVar57,auVar97);
          auVar62 = _local_24c0;
          auVar57 = vunpcklps_avx(auVar59,auVar84);
          auVar83 = vunpckhps_avx(auVar59,auVar84);
          auVar84 = vunpcklps_avx(auVar69,auVar68);
          auVar97 = vunpckhps_avx(auVar69,auVar68);
          auVar96 = *(undefined1 (*) [16])(lVar41 + uVar48 * 4);
          auVar68 = vunpcklps_avx(auVar83,auVar97);
          _local_24a0 = vunpcklps_avx(auVar57,auVar84);
          auVar34 = _local_24a0;
          _local_2640 = vunpckhps_avx(auVar57,auVar84);
          auVar7 = _local_2640;
          auVar83 = vunpcklps_avx(auVar5,auVar67);
          auVar67 = vunpckhps_avx(auVar5,auVar67);
          auVar97 = vunpcklps_avx(auVar98,auVar96);
          auVar96 = vunpckhps_avx(auVar98,auVar96);
          auVar98 = *(undefined1 (*) [16])(lVar41 + local_2610 * 4);
          auVar84 = vunpcklps_avx(auVar67,auVar96);
          auVar5 = vunpcklps_avx(auVar83,auVar97);
          auVar96 = vunpckhps_avx(auVar83,auVar97);
          auVar97 = vunpcklps_avx(auVar56,auVar98);
          auVar83 = vunpckhps_avx(auVar56,auVar98);
          auVar98 = *(undefined1 (*) [16])(lVar41 + uVar44 * 4);
          auVar67 = *(undefined1 (*) [16])(lVar41 + local_2618 * 4);
          auVar56 = vunpcklps_avx(auVar98,auVar67);
          auVar98 = vunpckhps_avx(auVar98,auVar67);
          auVar57 = vunpcklps_avx(auVar83,auVar98);
          auVar59 = vunpcklps_avx(auVar97,auVar56);
          auVar83 = vunpckhps_avx(auVar97,auVar56);
          auVar98 = *(undefined1 (*) [16])(lVar41 + uVar43 * 4);
          auVar67 = *(undefined1 (*) [16])(lVar41 + uVar47 * 4);
          auVar56 = vunpcklps_avx(auVar98,auVar67);
          auVar97 = vunpckhps_avx(auVar98,auVar67);
          auVar98 = *(undefined1 (*) [16])(lVar41 + uVar45 * 4);
          auVar67 = *(undefined1 (*) [16])(lVar41 + uVar39 * 4);
          auVar69 = vunpcklps_avx(auVar98,auVar67);
          auVar98 = vunpckhps_avx(auVar98,auVar67);
          auVar70 = vunpcklps_avx(auVar97,auVar98);
          auVar71 = vunpcklps_avx(auVar56,auVar69);
          auVar97 = vunpckhps_avx(auVar56,auVar69);
          auVar98 = vshufps_avx(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55),0);
          auVar67 = vshufps_avx(ZEXT416((uint)(1.0 - fVar55)),ZEXT416((uint)(1.0 - fVar55)),0);
          fVar55 = auVar98._0_4_;
          fVar64 = auVar98._4_4_;
          fVar65 = auVar98._8_4_;
          fVar66 = auVar98._12_4_;
          fVar120 = auVar67._0_4_;
          fVar141 = auVar67._4_4_;
          fVar142 = auVar67._8_4_;
          fVar143 = auVar67._12_4_;
          auVar115._0_4_ = fVar120 * auVar99._0_4_ + fVar55 * auVar5._0_4_;
          auVar115._4_4_ = fVar141 * auVar99._4_4_ + fVar64 * auVar5._4_4_;
          auVar115._8_4_ = fVar142 * auVar99._8_4_ + fVar65 * auVar5._8_4_;
          auVar115._12_4_ = fVar143 * auVar99._12_4_ + fVar66 * auVar5._12_4_;
          auVar118._0_4_ = fVar120 * auVar108._0_4_ + fVar55 * auVar96._0_4_;
          auVar118._4_4_ = fVar141 * auVar108._4_4_ + fVar64 * auVar96._4_4_;
          auVar118._8_4_ = fVar142 * auVar108._8_4_ + fVar65 * auVar96._8_4_;
          auVar118._12_4_ = fVar143 * auVar108._12_4_ + fVar66 * auVar96._12_4_;
          auVar109._0_4_ = fVar120 * (float)local_24b0._0_4_ + fVar55 * auVar84._0_4_;
          auVar109._4_4_ = fVar141 * (float)local_24b0._4_4_ + fVar64 * auVar84._4_4_;
          auVar109._8_4_ = fVar142 * fStack_24a8 + fVar65 * auVar84._8_4_;
          auVar109._12_4_ = fVar143 * fStack_24a4 + fVar66 * auVar84._12_4_;
          auVar69._0_4_ = fVar120 * auVar58._0_4_ + fVar55 * auVar59._0_4_;
          auVar69._4_4_ = fVar141 * auVar58._4_4_ + fVar64 * auVar59._4_4_;
          auVar69._8_4_ = fVar142 * auVar58._8_4_ + fVar65 * auVar59._8_4_;
          auVar69._12_4_ = fVar143 * auVar58._12_4_ + fVar66 * auVar59._12_4_;
          auVar85._0_4_ = fVar120 * (float)local_24c0._0_4_ + fVar55 * auVar83._0_4_;
          auVar85._4_4_ = fVar141 * (float)local_24c0._4_4_ + fVar64 * auVar83._4_4_;
          auVar85._8_4_ = fVar142 * fStack_24b8 + fVar65 * auVar83._8_4_;
          auVar85._12_4_ = fVar143 * fStack_24b4 + fVar66 * auVar83._12_4_;
          puVar2 = (undefined8 *)(uVar49 + 0x30 + lVar50);
          local_2490 = *puVar2;
          uStack_2488 = puVar2[1];
          puVar2 = (undefined8 *)(uVar49 + 0x40 + lVar50);
          local_2670._0_4_ = auVar114._0_4_;
          local_2670._4_4_ = auVar114._4_4_;
          fStack_2668 = auVar114._8_4_;
          fStack_2664 = auVar114._12_4_;
          auVar121._0_4_ = fVar120 * (float)local_2670._0_4_ + auVar57._0_4_ * fVar55;
          auVar121._4_4_ = fVar141 * (float)local_2670._4_4_ + auVar57._4_4_ * fVar64;
          auVar121._8_4_ = fVar142 * fStack_2668 + auVar57._8_4_ * fVar65;
          auVar121._12_4_ = fVar143 * fStack_2664 + auVar57._12_4_ * fVar66;
          auVar136._0_4_ = fVar120 * (float)local_24a0._0_4_ + auVar71._0_4_ * fVar55;
          auVar136._4_4_ = fVar141 * (float)local_24a0._4_4_ + auVar71._4_4_ * fVar64;
          auVar136._8_4_ = fVar142 * fStack_2498 + auVar71._8_4_ * fVar65;
          auVar136._12_4_ = fVar143 * fStack_2494 + auVar71._12_4_ * fVar66;
          auVar138._0_4_ = auVar97._0_4_ * fVar55 + fVar120 * (float)local_2640._0_4_;
          auVar138._4_4_ = auVar97._4_4_ * fVar64 + fVar141 * (float)local_2640._4_4_;
          auVar138._8_4_ = auVar97._8_4_ * fVar65 + fVar142 * fStack_2638;
          auVar138._12_4_ = auVar97._12_4_ * fVar66 + fVar143 * fStack_2634;
          local_2680._0_4_ = auVar68._0_4_;
          local_2680._4_4_ = auVar68._4_4_;
          fStack_2678 = auVar68._8_4_;
          fStack_2674 = auVar68._12_4_;
          auVar56._0_4_ = fVar120 * (float)local_2680._0_4_ + auVar70._0_4_ * fVar55;
          auVar56._4_4_ = fVar141 * (float)local_2680._4_4_ + auVar70._4_4_ * fVar64;
          auVar56._8_4_ = fVar142 * fStack_2678 + auVar70._8_4_ * fVar65;
          auVar56._12_4_ = fVar143 * fStack_2674 + auVar70._12_4_ * fVar66;
          local_2590 = *puVar2;
          uStack_2588 = puVar2[1];
          auVar98 = vsubps_avx(auVar115,auVar69);
          auVar67 = vsubps_avx(auVar118,auVar85);
          auVar96 = vsubps_avx(auVar109,auVar121);
          auVar83 = vsubps_avx(auVar136,auVar115);
          auVar108 = vsubps_avx(auVar138,auVar118);
          auVar97 = vsubps_avx(auVar56,auVar109);
          fVar66 = auVar97._0_4_;
          fVar123 = auVar67._0_4_;
          auVar57._0_4_ = fVar123 * fVar66;
          fVar11 = auVar97._4_4_;
          fVar125 = auVar67._4_4_;
          auVar57._4_4_ = fVar125 * fVar11;
          fVar16 = auVar97._8_4_;
          fVar127 = auVar67._8_4_;
          auVar57._8_4_ = fVar127 * fVar16;
          fVar21 = auVar97._12_4_;
          fVar129 = auVar67._12_4_;
          auVar57._12_4_ = fVar129 * fVar21;
          fVar120 = auVar108._0_4_;
          fVar131 = auVar96._0_4_;
          auVar70._0_4_ = fVar131 * fVar120;
          fVar12 = auVar108._4_4_;
          fVar133 = auVar96._4_4_;
          auVar70._4_4_ = fVar133 * fVar12;
          fVar17 = auVar108._8_4_;
          fVar134 = auVar96._8_4_;
          auVar70._8_4_ = fVar134 * fVar17;
          fVar22 = auVar108._12_4_;
          fVar135 = auVar96._12_4_;
          auVar70._12_4_ = fVar135 * fVar22;
          local_24f0 = vsubps_avx(auVar70,auVar57);
          fVar141 = auVar83._0_4_;
          auVar71._0_4_ = fVar131 * fVar141;
          fVar13 = auVar83._4_4_;
          auVar71._4_4_ = fVar133 * fVar13;
          fVar18 = auVar83._8_4_;
          auVar71._8_4_ = fVar134 * fVar18;
          fVar23 = auVar83._12_4_;
          auVar71._12_4_ = fVar135 * fVar23;
          fVar142 = auVar98._0_4_;
          auVar86._0_4_ = fVar66 * fVar142;
          fVar14 = auVar98._4_4_;
          auVar86._4_4_ = fVar11 * fVar14;
          fVar19 = auVar98._8_4_;
          auVar86._8_4_ = fVar16 * fVar19;
          fVar24 = auVar98._12_4_;
          auVar86._12_4_ = fVar21 * fVar24;
          auVar96 = vsubps_avx(auVar86,auVar71);
          auVar87._0_4_ = fVar120 * fVar142;
          auVar87._4_4_ = fVar12 * fVar14;
          auVar87._8_4_ = fVar17 * fVar19;
          auVar87._12_4_ = fVar22 * fVar24;
          auVar100._0_4_ = fVar123 * fVar141;
          auVar100._4_4_ = fVar125 * fVar13;
          auVar100._8_4_ = fVar127 * fVar18;
          auVar100._12_4_ = fVar129 * fVar23;
          local_2690 = vsubps_avx(auVar100,auVar87);
          uVar37 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar101._4_4_ = uVar37;
          auVar101._0_4_ = uVar37;
          auVar101._8_4_ = uVar37;
          auVar101._12_4_ = uVar37;
          uVar37 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar58._4_4_ = uVar37;
          auVar58._0_4_ = uVar37;
          auVar58._8_4_ = uVar37;
          auVar58._12_4_ = uVar37;
          uVar37 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar144._4_4_ = uVar37;
          auVar144._0_4_ = uVar37;
          auVar144._8_4_ = uVar37;
          auVar144._12_4_ = uVar37;
          fVar55 = (ray->super_RayK<1>).dir.field_0.m128[1];
          local_26a0 = vsubps_avx(auVar115,auVar101);
          fVar64 = (ray->super_RayK<1>).dir.field_0.m128[2];
          _local_2670 = vsubps_avx(auVar118,auVar58);
          auVar104 = ZEXT1664(_local_2670);
          _local_2680 = vsubps_avx(auVar109,auVar144);
          fVar143 = local_2680._0_4_;
          auVar110._0_4_ = fVar55 * fVar143;
          fVar15 = local_2680._4_4_;
          auVar110._4_4_ = fVar55 * fVar15;
          fVar20 = local_2680._8_4_;
          auVar110._8_4_ = fVar55 * fVar20;
          fVar25 = local_2680._12_4_;
          auVar110._12_4_ = fVar55 * fVar25;
          fVar95 = local_2670._0_4_;
          auVar145._0_4_ = fVar95 * fVar64;
          fVar105 = local_2670._4_4_;
          auVar145._4_4_ = fVar105 * fVar64;
          fVar106 = local_2670._8_4_;
          auVar145._8_4_ = fVar106 * fVar64;
          fVar107 = local_2670._12_4_;
          auVar145._12_4_ = fVar107 * fVar64;
          auVar67 = vsubps_avx(auVar145,auVar110);
          fVar65 = (ray->super_RayK<1>).dir.field_0.m128[0];
          fVar82 = local_26a0._0_4_;
          auVar59._0_4_ = fVar82 * fVar64;
          fVar92 = local_26a0._4_4_;
          auVar59._4_4_ = fVar92 * fVar64;
          fVar93 = local_26a0._8_4_;
          auVar59._8_4_ = fVar93 * fVar64;
          fVar94 = local_26a0._12_4_;
          auVar59._12_4_ = fVar94 * fVar64;
          auVar72._0_4_ = fVar143 * fVar65;
          auVar72._4_4_ = fVar15 * fVar65;
          auVar72._8_4_ = fVar20 * fVar65;
          auVar72._12_4_ = fVar25 * fVar65;
          auVar83 = vsubps_avx(auVar72,auVar59);
          auVar73._0_4_ = fVar95 * fVar65;
          auVar73._4_4_ = fVar105 * fVar65;
          auVar73._8_4_ = fVar106 * fVar65;
          auVar73._12_4_ = fVar107 * fVar65;
          auVar88._0_4_ = fVar55 * fVar82;
          auVar88._4_4_ = fVar55 * fVar92;
          auVar88._8_4_ = fVar55 * fVar93;
          auVar88._12_4_ = fVar55 * fVar94;
          auVar108 = vsubps_avx(auVar88,auVar73);
          auVar97 = local_2690;
          auVar89._0_4_ =
               local_24f0._0_4_ * fVar65 + fVar55 * auVar96._0_4_ + local_2690._0_4_ * fVar64;
          auVar89._4_4_ =
               local_24f0._4_4_ * fVar65 + fVar55 * auVar96._4_4_ + local_2690._4_4_ * fVar64;
          auVar89._8_4_ =
               local_24f0._8_4_ * fVar65 + fVar55 * auVar96._8_4_ + local_2690._8_4_ * fVar64;
          auVar89._12_4_ =
               local_24f0._12_4_ * fVar65 + fVar55 * auVar96._12_4_ + local_2690._12_4_ * fVar64;
          auVar74._8_8_ = 0x8000000080000000;
          auVar74._0_8_ = 0x8000000080000000;
          auVar98 = vandps_avx(auVar89,auVar74);
          uVar42 = auVar98._0_4_;
          local_2580._0_4_ =
               (float)(uVar42 ^ (uint)(fVar141 * auVar67._0_4_ +
                                      fVar120 * auVar83._0_4_ + fVar66 * auVar108._0_4_));
          uVar126 = auVar98._4_4_;
          local_2580._4_4_ =
               (float)(uVar126 ^
                      (uint)(fVar13 * auVar67._4_4_ +
                            fVar12 * auVar83._4_4_ + fVar11 * auVar108._4_4_));
          uVar128 = auVar98._8_4_;
          local_2580._8_4_ =
               (float)(uVar128 ^
                      (uint)(fVar18 * auVar67._8_4_ +
                            fVar17 * auVar83._8_4_ + fVar16 * auVar108._8_4_));
          uVar130 = auVar98._12_4_;
          local_2580._12_4_ =
               (float)(uVar130 ^
                      (uint)(fVar23 * auVar67._12_4_ +
                            fVar22 * auVar83._12_4_ + fVar21 * auVar108._12_4_));
          auVar113 = ZEXT1664(local_2580._0_16_);
          local_2580._16_4_ =
               (float)(uVar42 ^ (uint)(auVar67._0_4_ * fVar142 +
                                      fVar123 * auVar83._0_4_ + fVar131 * auVar108._0_4_));
          local_2580._20_4_ =
               (float)(uVar126 ^
                      (uint)(auVar67._4_4_ * fVar14 +
                            fVar125 * auVar83._4_4_ + fVar133 * auVar108._4_4_));
          local_2580._24_4_ =
               (float)(uVar128 ^
                      (uint)(auVar67._8_4_ * fVar19 +
                            fVar127 * auVar83._8_4_ + fVar134 * auVar108._8_4_));
          local_2580._28_4_ =
               (float)(uVar130 ^
                      (uint)(auVar67._12_4_ * fVar24 +
                            fVar129 * auVar83._12_4_ + fVar135 * auVar108._12_4_));
          auVar117 = ZEXT1664(local_2580._16_16_);
          auVar83 = ZEXT816(0) << 0x20;
          auVar98 = vcmpps_avx(local_2580._0_16_,auVar83,5);
          auVar67 = vcmpps_avx(local_2580._16_16_,auVar83,5);
          auVar98 = vandps_avx(auVar98,auVar67);
          auVar75._8_4_ = 0x7fffffff;
          auVar75._0_8_ = 0x7fffffff7fffffff;
          auVar75._12_4_ = 0x7fffffff;
          local_2550 = vandps_avx(auVar89,auVar75);
          auVar67 = vcmpps_avx(auVar83,auVar89,4);
          auVar98 = vandps_avx(auVar98,auVar67);
          auVar76._0_4_ = local_2580._0_4_ + local_2580._16_4_;
          auVar76._4_4_ = local_2580._4_4_ + local_2580._20_4_;
          auVar76._8_4_ = local_2580._8_4_ + local_2580._24_4_;
          auVar76._12_4_ = local_2580._12_4_ + local_2580._28_4_;
          auVar67 = vcmpps_avx(auVar76,local_2550,2);
          auVar98 = vandps_avx(auVar98,auVar67);
          auVar5._8_8_ = uStack_2598;
          auVar5._0_8_ = local_25a0;
          auVar5 = auVar5 & auVar98;
          context = local_2648;
          if ((((auVar5 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar5 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar5 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar5[0xf] < '\0') {
            auVar33._8_8_ = uStack_2598;
            auVar33._0_8_ = local_25a0;
            auVar98 = vandps_avx(auVar98,auVar33);
            local_2560._0_4_ =
                 (float)(uVar42 ^ (uint)(local_24f0._0_4_ * fVar82 +
                                        fVar95 * auVar96._0_4_ + fVar143 * local_2690._0_4_));
            local_2560._4_4_ =
                 (float)(uVar126 ^
                        (uint)(local_24f0._4_4_ * fVar92 +
                              fVar105 * auVar96._4_4_ + fVar15 * local_2690._4_4_));
            local_2560._8_4_ =
                 (float)(uVar128 ^
                        (uint)(local_24f0._8_4_ * fVar93 +
                              fVar106 * auVar96._8_4_ + fVar20 * local_2690._8_4_));
            local_2560._12_4_ =
                 (float)(uVar130 ^
                        (uint)(local_24f0._12_4_ * fVar94 +
                              fVar107 * auVar96._12_4_ + fVar25 * local_2690._12_4_));
            fVar55 = (ray->super_RayK<1>).org.field_0.m128[3];
            fVar64 = local_2550._0_4_;
            auVar60._0_4_ = fVar64 * fVar55;
            fVar65 = local_2550._4_4_;
            auVar60._4_4_ = fVar65 * fVar55;
            fVar66 = local_2550._8_4_;
            auVar60._8_4_ = fVar66 * fVar55;
            fVar120 = local_2550._12_4_;
            auVar60._12_4_ = fVar120 * fVar55;
            auVar67 = vcmpps_avx(auVar60,local_2560,1);
            fVar55 = (ray->super_RayK<1>).tfar;
            auVar77._0_4_ = fVar64 * fVar55;
            auVar77._4_4_ = fVar65 * fVar55;
            auVar77._8_4_ = fVar66 * fVar55;
            auVar77._12_4_ = fVar120 * fVar55;
            auVar83 = vcmpps_avx(local_2560,auVar77,2);
            auVar67 = vandps_avx(auVar83,auVar67);
            auVar104 = ZEXT1664(auVar67);
            auVar83 = auVar98 & auVar67;
            if ((((auVar83 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar83 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar83 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar83[0xf] < '\0') {
              auVar6._0_4_ = (ray->super_RayK<1>).tfar;
              auVar6._4_4_ = (ray->super_RayK<1>).mask;
              auVar6._8_4_ = (ray->super_RayK<1>).id;
              auVar6._12_4_ = (ray->super_RayK<1>).flags;
              auVar81 = ZEXT1664(auVar6);
              auVar98 = vandps_avx(auVar98,auVar67);
              local_2530 = auVar98;
              local_26e0 = auVar96._0_8_;
              uStack_26d8 = auVar96._8_8_;
              local_24e0 = local_26e0;
              uStack_24d8 = uStack_26d8;
              local_24d0 = local_2690._0_8_;
              uStack_24c8 = local_2690._8_8_;
              local_2660 = auVar98;
              auVar67 = vrcpps_avx(local_2550);
              fVar55 = auVar67._0_4_;
              auVar78._0_4_ = fVar64 * fVar55;
              fVar64 = auVar67._4_4_;
              auVar78._4_4_ = fVar65 * fVar64;
              fVar65 = auVar67._8_4_;
              auVar78._8_4_ = fVar66 * fVar65;
              fVar66 = auVar67._12_4_;
              auVar78._12_4_ = fVar120 * fVar66;
              auVar90._8_4_ = 0x3f800000;
              auVar90._0_8_ = 0x3f8000003f800000;
              auVar90._12_4_ = 0x3f800000;
              auVar67 = vsubps_avx(auVar90,auVar78);
              fVar55 = fVar55 + fVar55 * auVar67._0_4_;
              fVar64 = fVar64 + fVar64 * auVar67._4_4_;
              fVar65 = fVar65 + fVar65 * auVar67._8_4_;
              fVar66 = fVar66 + fVar66 * auVar67._12_4_;
              local_2500._0_4_ = fVar55 * local_2560._0_4_;
              local_2500._4_4_ = fVar64 * local_2560._4_4_;
              local_2500._8_4_ = fVar65 * local_2560._8_4_;
              local_2500._12_4_ = fVar66 * local_2560._12_4_;
              auVar63 = ZEXT1664(local_2500);
              local_2520[0] = fVar55 * local_2580._0_4_;
              local_2520[1] = fVar64 * local_2580._4_4_;
              local_2520[2] = fVar65 * local_2580._8_4_;
              local_2520[3] = fVar66 * local_2580._12_4_;
              local_2510[0] = fVar55 * local_2580._16_4_;
              local_2510[1] = fVar64 * local_2580._20_4_;
              local_2510[2] = fVar65 * local_2580._24_4_;
              local_2510[3] = fVar66 * local_2580._28_4_;
              auVar61._8_4_ = 0x7f800000;
              auVar61._0_8_ = 0x7f8000007f800000;
              auVar61._12_4_ = 0x7f800000;
              auVar67 = vblendvps_avx(auVar61,local_2500,auVar98);
              auVar96 = vshufps_avx(auVar67,auVar67,0xb1);
              auVar96 = vminps_avx(auVar96,auVar67);
              auVar83 = vshufpd_avx(auVar96,auVar96,1);
              auVar96 = vminps_avx(auVar83,auVar96);
              auVar67 = vcmpps_avx(auVar67,auVar96,0);
              auVar96 = auVar98 & auVar67;
              if ((((auVar96 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar96 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar96 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar96[0xf] < '\0') {
                auVar98 = vandps_avx(auVar67,auVar98);
              }
              uVar42 = vextractps_avx(auVar6,1);
              uVar37 = vmovmskps_avx(auVar98);
              uVar39 = CONCAT44((int)((ulong)local_2648 >> 0x20),uVar37);
              lVar36 = 0;
              local_2690 = auVar97;
              _local_2640 = auVar7;
              _local_24c0 = auVar62;
              _local_24b0 = auVar79;
              _local_24a0 = auVar34;
              if (uVar39 != 0) {
                for (; (uVar39 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                }
              }
LAB_00e5e54c:
              local_26a0 = auVar81._0_16_;
              auVar67 = auVar63._0_16_;
              auVar104 = ZEXT1664(auVar98);
              local_25b8 = *(uint *)((long)&local_2490 + lVar36 * 4);
              auVar40 = (undefined1  [8])(ulong)local_25b8;
              pGVar9 = (pSVar8->geometries).items[(long)auVar40].ptr;
              if ((pGVar9->mask & uVar42) == 0) {
                *(undefined4 *)(local_2660 + lVar36 * 4) = 0;
              }
              else {
                pRVar10 = context->args;
                if (pRVar10->filter == (RTCFilterFunctionN)0x0) {
                  local_2600.context = context->user;
                  if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                    fVar55 = local_2520[lVar36];
                    fVar64 = local_2510[lVar36];
                    (ray->super_RayK<1>).tfar = *(float *)(local_2500 + lVar36 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_24f0 + lVar36 * 4);
                    (ray->Ng).field_0.field_0.y = *(float *)((long)&local_24e0 + lVar36 * 4);
                    (ray->Ng).field_0.field_0.z = *(float *)((long)&local_24d0 + lVar36 * 4);
                    ray->u = fVar55;
                    ray->v = fVar64;
                    ray->primID = *(uint *)((long)&local_2590 + lVar36 * 4);
                    ray->geomID = local_25b8;
                    ray->instID[0] = (local_2600.context)->instID[0];
                    ray->instPrimID[0] = (local_2600.context)->instPrimID[0];
                    goto LAB_00e5e397;
                  }
                }
                else {
                  local_2600.context = context->user;
                }
                local_25cc = *(uint *)((long)&local_24e0 + lVar36 * 4);
                auVar104 = ZEXT464(local_25cc);
                local_25c8 = *(uint *)((long)&local_24d0 + lVar36 * 4);
                auVar113 = ZEXT464(local_25c8);
                local_25d0 = *(float *)(local_24f0 + lVar36 * 4);
                local_25c4 = local_2520[lVar36];
                local_25c0 = local_2510[lVar36];
                local_25bc = *(undefined4 *)((long)&local_2590 + lVar36 * 4);
                local_25b4 = (local_2600.context)->instID[0];
                local_25b0 = (local_2600.context)->instPrimID[0];
                local_2690._0_8_ = lVar36;
                (ray->super_RayK<1>).tfar = *(float *)(local_2500 + lVar36 * 4);
                local_26a4 = -1;
                local_2600.valid = &local_26a4;
                auVar40 = (undefined1  [8])pGVar9->userPtr;
                local_2600.geometryUserPtr = (void *)auVar40;
                local_2600.ray = (RTCRayN *)ray;
                local_2600.hit = (RTCHitN *)&local_25d0;
                local_2600.N = 1;
                local_2670 = (undefined1  [8])pGVar9;
                if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e5e724:
                  if ((pRVar10->filter != (RTCFilterFunctionN)0x0) &&
                     ((auVar40 = (undefined1  [8])pRVar10,
                      (pRVar10->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                      RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (auVar40 = local_2670,
                      ((ulong)((RTCIntersectArguments *)((long)local_2670 + 0x20))->intersect &
                      0x40000000000000) != 0)))) {
                    auVar104 = ZEXT1664(auVar104._0_16_);
                    auVar113 = ZEXT1664(auVar113._0_16_);
                    auVar117 = ZEXT1664(auVar117._0_16_);
                    (*pRVar10->filter)(&local_2600);
                    if (*local_2600.valid == 0) goto LAB_00e5e7bf;
                  }
                  (((Vec3f *)((long)local_2600.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_2600.hit;
                  (((Vec3f *)((long)local_2600.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_2600.hit + 4);
                  (((Vec3f *)((long)local_2600.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_2600.hit + 8);
                  *(float *)((long)local_2600.ray + 0x3c) = *(float *)(local_2600.hit + 0xc);
                  *(float *)((long)local_2600.ray + 0x40) = *(float *)(local_2600.hit + 0x10);
                  *(float *)((long)local_2600.ray + 0x44) = *(float *)(local_2600.hit + 0x14);
                  *(float *)((long)local_2600.ray + 0x48) = *(float *)(local_2600.hit + 0x18);
                  *(float *)((long)local_2600.ray + 0x4c) = *(float *)(local_2600.hit + 0x1c);
                  auVar40 = (undefined1  [8])0x0;
                  *(float *)((long)local_2600.ray + 0x50) = *(float *)(local_2600.hit + 0x20);
                }
                else {
                  auVar104 = ZEXT464(local_25cc);
                  auVar113 = ZEXT464(local_25c8);
                  auVar117 = ZEXT1664(auVar117._0_16_);
                  (*pGVar9->intersectionFilterN)(&local_2600);
                  if (*local_2600.valid != 0) goto LAB_00e5e724;
LAB_00e5e7bf:
                  (ray->super_RayK<1>).tfar = (float)local_26a0._0_4_;
                }
                *(undefined4 *)(local_2660 + local_2690._0_8_ * 4) = 0;
                fVar55 = (ray->super_RayK<1>).tfar;
                auVar62._4_4_ = fVar55;
                auVar62._0_4_ = fVar55;
                auVar62._8_4_ = fVar55;
                auVar62._12_4_ = fVar55;
                auVar63 = ZEXT1664(auVar67);
                auVar98 = vcmpps_avx(auVar67,auVar62,2);
                local_2660 = vandps_avx(auVar98,local_2660);
                auVar7._0_4_ = (ray->super_RayK<1>).tfar;
                auVar7._4_4_ = (ray->super_RayK<1>).mask;
                auVar7._8_4_ = (ray->super_RayK<1>).id;
                auVar7._12_4_ = (ray->super_RayK<1>).flags;
                auVar81 = ZEXT1664(auVar7);
                uVar42 = vextractps_avx(auVar7,1);
                context = local_2648;
              }
              if ((((local_2660 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_2660 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_2660 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_2660[0xf]) goto LAB_00e5e397;
              auVar79._8_4_ = 0x7f800000;
              auVar79._0_8_ = 0x7f8000007f800000;
              auVar79._12_4_ = 0x7f800000;
              auVar67 = vblendvps_avx(auVar79,auVar63._0_16_,local_2660);
              auVar98 = vshufps_avx(auVar67,auVar67,0xb1);
              auVar96 = vminps_avx(auVar98,auVar67);
              auVar98 = vshufpd_avx(auVar96,auVar96,1);
              auVar96 = vminps_avx(auVar98,auVar96);
              auVar96 = vcmpps_avx(auVar67,auVar96,0);
              auVar83 = local_2660 & auVar96;
              auVar67 = local_2660;
              if ((((auVar83 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar83 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar83 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar83[0xf] < '\0') {
                auVar67 = vandps_avx(auVar96,local_2660);
              }
              uVar37 = vmovmskps_avx(auVar67);
              uVar39 = CONCAT44((int)((ulong)auVar40 >> 0x20),uVar37);
              lVar36 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                }
              }
              goto LAB_00e5e54c;
            }
          }
LAB_00e5e397:
          auVar119 = ZEXT3264(local_23c0);
          auVar122 = ZEXT3264(local_23e0);
          auVar124 = ZEXT3264(local_2400);
          auVar132 = ZEXT3264(local_2420);
          auVar137 = ZEXT3264(local_2440);
          auVar139 = ZEXT3264(local_2460);
          auVar140 = ZEXT3264(local_2480);
          uVar39 = local_2628;
        }
        fVar55 = (ray->super_RayK<1>).tfar;
        auVar63 = ZEXT3264(CONCAT428(fVar55,CONCAT424(fVar55,CONCAT420(fVar55,CONCAT416(fVar55,
                                                  CONCAT412(fVar55,CONCAT48(fVar55,CONCAT44(fVar55,
                                                  fVar55))))))));
        auVar81 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
      }
      goto LAB_00e5da56;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }